

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

void __thiscall
clipp::parameter::parameter<char_const(&)[11]>(parameter *this,arg_string *str,char (*strs) [11])

{
  code *local_78 [2];
  _Manager_type local_68;
  undefined8 uStack_60;
  predicate_adapter local_58;
  
  (this->super_token<clipp::parameter>).doc_._M_dataplus._M_p =
       (pointer)&(this->super_token<clipp::parameter>).doc_.field_2;
  (this->super_token<clipp::parameter>).doc_._M_string_length = 0;
  (this->super_token<clipp::parameter>).doc_.field_2._M_local_buf[0] = '\0';
  (this->super_token<clipp::parameter>).repeatable_ = false;
  (this->super_token<clipp::parameter>).blocking_ = false;
  memset(&this->super_action_provider<clipp::parameter>,0,0x90);
  local_78[1] = (code *)0x0;
  local_78[0] = clipp::match::none;
  local_58.match_._M_invoker =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_bool_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_58.match_.super__Function_base._M_functor._M_unused._M_object = clipp::match::none;
  local_58.match_.super__Function_base._M_functor._8_8_ = 0;
  local_58.match_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_bool_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  local_68 = (_Manager_type)0x0;
  uStack_60 = 0;
  std::function<clipp::subrange(std::__cxx11::string_const&)>::
  function<clipp::parameter::predicate_adapter,void>
            ((function<clipp::subrange(std::__cxx11::string_const&)> *)&this->matcher_,&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)local_78);
  (this->label_)._M_dataplus._M_p = (pointer)&(this->label_).field_2;
  (this->label_)._M_string_length = 0;
  (this->label_).field_2._M_local_buf[0] = '\0';
  this->required_ = false;
  this->greedy_ = false;
  add_flags<std::__cxx11::string,char_const(&)[11]>(this,str,strs);
  return;
}

Assistant:

explicit
    parameter(arg_string str, Strings&&... strs):
        flags_{},
        matcher_{predicate_adapter{match::none}},
        label_{}, required_{false}, greedy_{false}
    {
        add_flags(std::move(str), std::forward<Strings>(strs)...);
    }